

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O3

int b_replace(lua_State *L)

{
  uint uVar1;
  undefined8 in_RAX;
  lua_Integer lVar2;
  lua_Integer lVar3;
  ulong uVar4;
  int w;
  char local_24 [4];
  
  local_24[0] = (char)((ulong)in_RAX >> 0x20);
  lVar2 = luaL_checkinteger(L,1);
  lVar3 = luaL_checkinteger(L,2);
  uVar1 = fieldargs(L,3,(int *)local_24);
  uVar4 = ~(0x1fffffffe << ((ulong)(byte)(local_24[0] - 1) & 0x3f));
  lua_pushinteger(L,(ulong)((uint)uVar4 & (uint)lVar3) << ((ulong)uVar1 & 0x3f) |
                    (ulong)(~(uint)(uVar4 << ((ulong)uVar1 & 0x3f)) & (uint)lVar2));
  return 1;
}

Assistant:

static int b_replace (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  lua_Unsigned v = trim(checkunsigned(L, 2));
  int f = fieldargs(L, 3, &w);
  lua_Unsigned m = mask(w);
  r = (r & ~(m << f)) | ((v & m) << f);
  pushunsigned(L, r);
  return 1;
}